

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O2

PinholeCamera * __thiscall gmath::PinholeCamera::operator=(PinholeCamera *this,PinholeCamera *pc)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (this != pc) {
    Camera::operator=(&this->super_Camera,&pc->super_Camera);
    SMatrix<double,_3,_3>::operator=(&this->A,&pc->A);
    this->rho = pc->rho;
    if (this->dist != (Distortion *)0x0) {
      (*this->dist->_vptr_Distortion[1])();
    }
    this->dist = (Distortion *)0x0;
    if (pc->dist != (Distortion *)0x0) {
      iVar1 = (*pc->dist->_vptr_Distortion[2])();
      this->dist = (Distortion *)CONCAT44(extraout_var,iVar1);
    }
  }
  return this;
}

Assistant:

PinholeCamera &PinholeCamera::operator = (const PinholeCamera &pc)
{
  if (this != &pc)
  {
    Camera::operator=(pc);

    A=pc.A;
    rho=pc.rho;

    delete dist;
    dist=0;

    if (pc.dist != 0)
    {
      dist=pc.dist->clone();
    }
  }

  return *this;
}